

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinity.cpp
# Opt level: O0

int set_thread_affinity(uint *cpuid)

{
  int iVar1;
  native_handle_type thread;
  uint *in_stack_00000088;
  native_handle_type in_stack_00000090;
  
  pthread_self();
  iVar1 = set_thread_affinity(in_stack_00000090,in_stack_00000088);
  return iVar1;
}

Assistant:

int
set_thread_affinity(const unsigned &cpuid)
{
    std::thread::native_handle_type thread;
#if defined(_WIN32) || defined(__CYGWIN__)
    thread = reinterpret_cast<std::thread::native_handle_type>(GetCurrentThread());
#else
    thread = static_cast<std::thread::native_handle_type>(pthread_self());
#endif
    return set_thread_affinity(thread, cpuid);
}